

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sys_psx_DynamicLib.cpp
# Opt level: O3

int __thiscall axl::sys::psx::DynamicLib::open(DynamicLib *this,char *__file,int __oflag,...)

{
  C *pCVar1;
  void *pvVar2;
  char *string;
  void *extraout_RAX;
  void *pvVar3;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_48;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_30;
  
  if ((this->super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>).m_h !=
      (void *)0x0) {
    dlclose();
    (this->super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>).m_h =
         (void *)0x0;
  }
  if (*(long *)(__file + 0x10) == 0) {
    pCVar1 = &sl::StringDetailsImpl<char>::getEmptyString()::emptyString;
  }
  else {
    pCVar1 = sl::StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::ensureNullTerminated
                       ((StringRefBase<char,_axl::sl::StringDetailsBase<char>_> *)__file);
  }
  pvVar2 = (void *)dlopen(pCVar1,__oflag);
  (this->super_Handle<void_*,_axl::sys::psx::CloseDynamicLib,_axl::sl::Zero<void_*>_>).m_h = pvVar2;
  pvVar3 = pvVar2;
  if (pvVar2 == (void *)0x0) {
    string = (char *)dlerror();
    err::Error::Error((Error *)&local_30,string);
    local_48.m_p = (ErrorHdr *)0x0;
    local_48.m_hdr = (BufHdr *)0x0;
    local_48.m_size = 0;
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move(&local_48,&local_30);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_30);
    err::setError((ErrorRef *)&local_48);
    rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::release(&local_48);
    pvVar3 = extraout_RAX;
  }
  return (int)CONCAT71((int7)((ulong)pvVar3 >> 8),pvVar2 != (void *)0x0);
}

Assistant:

bool
DynamicLib::open(
	const sl::StringRef& name,
	int flags
) {
	close();

	m_h = ::dlopen(name.sz(), flags);
	if (!m_h) {
		err::setError(::dlerror());
		return false;
	}

	return true;
}